

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

int __thiscall QToolBarAreaLayout::remove(QToolBarAreaLayout *this,char *__filename)

{
  bool bVar1;
  int extraout_EAX;
  const_reference piVar3;
  undefined7 extraout_var;
  QToolBarAreaLayoutLine *line;
  QToolBarAreaLayoutInfo *dock;
  qsizetype in_stack_ffffffffffffffb8;
  QList<QToolBarAreaLayoutLine> *in_stack_ffffffffffffffc0;
  QToolBarAreaLayoutInfo *this_00;
  int iVar2;
  
  piVar3 = QList<int>::at((QList<int> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = this->docks + *piVar3;
  QList<int>::at((QList<int> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  QList<QToolBarAreaLayoutLine>::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  QList<int>::at((QList<int> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  QList<QToolBarAreaLayoutItem>::removeAt
            ((QList<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  bVar1 = QList<QToolBarAreaLayoutItem>::isEmpty((QList<QToolBarAreaLayoutItem> *)0x6f4ae6);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    QList<int>::at((QList<int> *)this_00,in_stack_ffffffffffffffb8);
    QList<QToolBarAreaLayoutLine>::removeAt(&this_00->lines,in_stack_ffffffffffffffb8);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void QToolBarAreaLayout::remove(const QList<int> &path)
{
    Q_ASSERT(path.size() == 3);
    QToolBarAreaLayoutInfo &dock = docks[path.at(0)];
    QToolBarAreaLayoutLine &line = dock.lines[path.at(1)];
    line.toolBarItems.removeAt(path.at(2));
    if (line.toolBarItems.isEmpty())
        dock.lines.removeAt(path.at(1));
}